

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall
HashUtil_Hash160Bytes_Test::~HashUtil_Hash160Bytes_Test(HashUtil_Hash160Bytes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HashUtil, Hash160Bytes) {
  std::vector<uint8_t> target;
  target.push_back(0x01);
  target.push_back(0x02);
  target.push_back(0x03);
  ByteData160 byte_data = HashUtil::Hash160(target);
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "9bc4860bb936abf262d7a51f74b4304833fee3b2");
}